

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::GradX
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  TPZFNMatrix<54,_double> cornerco;
  
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(gradx,3,0);
  TPZFNMatrix<54,_double>::TPZFNMatrix(&cornerco,3,1);
  CornerCoordinates(this,&cornerco.super_TPZFMatrix<double>);
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(gradx,3,0);
  TPZFNMatrix<54,_double>::~TPZFNMatrix(&cornerco);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<Fad<REAL> > &par, TPZFMatrix<Fad<REAL> > &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}